

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall OpenMD::ForceMatrixDecomposition::distributeData(ForceMatrixDecomposition *this)

{
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeData() {
#ifdef IS_MPI

    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();

    bool needsCG = true;
    if (info_->getNCutoffGroups() != info_->getNAtoms()) needsCG = false;

    // gather up the atomic positions
    AtomPlanVectorRow->gather(snap_->atomData.position, atomRowData.position);
    AtomPlanVectorColumn->gather(snap_->atomData.position,
                                 atomColData.position);

    // gather up the cutoff group positions

    if (needsCG) {
      cgPlanVectorRow->gather(snap_->cgData.position, cgRowData.position);

      cgPlanVectorColumn->gather(snap_->cgData.position, cgColData.position);
    }

    if (needVelocities_) {
      // gather up the atomic velocities
      AtomPlanVectorColumn->gather(snap_->atomData.velocity,
                                   atomColData.velocity);

      if (needsCG) {
        cgPlanVectorColumn->gather(snap_->cgData.velocity, cgColData.velocity);
      }
    }

    // if needed, gather the atomic rotation matrices
    if (atomStorageLayout_ & DataStorage::dslAmat) {
      AtomPlanMatrixRow->gather(snap_->atomData.aMat, atomRowData.aMat);
      AtomPlanMatrixColumn->gather(snap_->atomData.aMat, atomColData.aMat);
    }

    // if needed, gather the atomic eletrostatic information
    if (atomStorageLayout_ & DataStorage::dslDipole) {
      AtomPlanVectorRow->gather(snap_->atomData.dipole, atomRowData.dipole);
      AtomPlanVectorColumn->gather(snap_->atomData.dipole, atomColData.dipole);
    }

    if (atomStorageLayout_ & DataStorage::dslQuadrupole) {
      AtomPlanMatrixRow->gather(snap_->atomData.quadrupole,
                                atomRowData.quadrupole);
      AtomPlanMatrixColumn->gather(snap_->atomData.quadrupole,
                                   atomColData.quadrupole);
    }

    // if needed, gather the atomic fluctuating charge values
    if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
      AtomPlanRealRow->gather(snap_->atomData.flucQPos, atomRowData.flucQPos);
      AtomPlanRealColumn->gather(snap_->atomData.flucQPos,
                                 atomColData.flucQPos);
    }

#endif
  }